

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::debugging_internal::anon_unknown_0::RustSymbolParser::ParseDisambiguator
          (RustSymbolParser *this,int *value)

{
  bool bVar1;
  RustSymbolParser *in_RSI;
  RustSymbolParser *in_RDI;
  int base_62_value;
  int local_2c;
  uint in_stack_ffffffffffffffe0;
  bool local_1;
  
  in_RSI->recursion_stack_[0] = ~kInstantiatingCrate;
  in_RSI->recursion_stack_[1] = ~kInstantiatingCrate;
  in_RSI->recursion_stack_[2] = ~kInstantiatingCrate;
  in_RSI->recursion_stack_[3] = ~kInstantiatingCrate;
  bVar1 = Eat(in_RDI,'s');
  if (bVar1) {
    local_2c = 0;
    bVar1 = ParseBase62Number(in_RSI,(int *)(ulong)in_stack_ffffffffffffffe0);
    if (bVar1) {
      if (local_2c < 0) {
        local_2c = -1;
      }
      else {
        local_2c = local_2c + 1;
      }
      *(int *)in_RSI->recursion_stack_ = local_2c;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    in_RSI->recursion_stack_[0] = kInstantiatingCrate;
    in_RSI->recursion_stack_[1] = kInstantiatingCrate;
    in_RSI->recursion_stack_[2] = kInstantiatingCrate;
    in_RSI->recursion_stack_[3] = kInstantiatingCrate;
    local_1 = true;
  }
  return local_1;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseDisambiguator(int& value) {
    value = -1;

    // disambiguator = s base-62-number
    //
    // Disambiguators are optional.  An omitted disambiguator is zero.
    if (!Eat('s')) {
      value = 0;
      return true;
    }
    int base_62_value = 0;
    if (!ParseBase62Number(base_62_value)) return false;
    value = base_62_value < 0 ? -1 : base_62_value + 1;
    return true;
  }